

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O2

void __thiscall setup::version::load(version *this,istream *is)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  size_t count;
  _WordT _Var10;
  undefined8 *puVar11;
  char cVar12;
  string *this_00;
  long lVar13;
  stored_legacy_version legacy_version;
  string version_str;
  stored_version version_string;
  undefined1 local_38 [8];
  
  std::istream::read((char *)is,(long)legacy_version);
  if ((legacy_version[0] == 'i') && (legacy_version[0xb] == '\x1a')) {
    lVar13 = 0;
    do {
      lVar8 = lVar13;
      if (lVar8 + 0x20 == 0x60) {
        if ((((legacy_version[2] != '.') || (legacy_version[4] != '.')) ||
            (legacy_version[7] != '-')) || (legacy_version[8] != '-')) {
LAB_0013b50d:
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = &PTR__exception_0016d398;
          __cxa_throw(puVar11,&version_error::typeinfo,std::exception::~exception);
        }
        if (legacy_version[10] == '6' && legacy_version[9] == '1') {
          flags<setup::version::flags_Enum_,_3UL>::flags
                    ((flags<setup::version::flags_Enum_,_3UL> *)version_string,Bits16);
          (this->variant)._flags.super__Base_bitset<1UL>._M_w = version_string._0_8_;
        }
        else {
          if ((legacy_version[9] != '3') || (legacy_version[10] != '2')) goto LAB_0013b50d;
          (this->variant)._flags.super__Base_bitset<1UL>._M_w = 0;
        }
        version_string._0_8_ = version_string + 0x10;
        version_string[0x18] = legacy_version[8];
        version_string[0x19] = legacy_version[9];
        version_string[0x1a] = legacy_version[10];
        version_string[0x1b] = legacy_version[0xb];
        version_string[8] = '\f';
        version_string[9] = '\0';
        version_string[10] = '\0';
        version_string[0xb] = '\0';
        version_string[0xc] = '\0';
        version_string[0xd] = '\0';
        version_string[0xe] = '\0';
        version_string[0xf] = '\0';
        version_string[0x1c] = '\0';
        uVar4 = util::to_unsigned(version_string + 0x11,1);
        uVar5 = util::to_unsigned((char *)(version_string._0_8_ + 3),1);
        uVar6 = util::to_unsigned((char *)(version_string._0_8_ + 5),2);
        this->value = uVar6 << 8 | uVar5 << 0x10 | uVar4 << 0x18;
        this->known = false;
        this_00 = (string *)version_string;
        goto LAB_0013b4f6;
      }
      iVar2 = bcmp(legacy_version,(anonymous_namespace)::legacy_versions + lVar8,0xc);
      lVar13 = lVar8 + 0x20;
    } while (iVar2 != 0);
    this->value = *(version_constant *)((anonymous_namespace)::legacy_versions + lVar8 + 0x10);
    _Var10 = *(_WordT *)((anonymous_namespace)::legacy_versions + lVar8 + 0x18);
LAB_0013b460:
    (this->variant)._flags.super__Base_bitset<1UL>._M_w = _Var10;
    this->known = true;
  }
  else {
    version_string[8] = legacy_version[8];
    version_string[9] = legacy_version[9];
    version_string[10] = legacy_version[10];
    version_string[0xb] = legacy_version[0xb];
    version_string[1] = legacy_version[1];
    version_string[0] = legacy_version[0];
    version_string[2] = legacy_version[2];
    version_string[3] = legacy_version[3];
    version_string[4] = legacy_version[4];
    version_string[5] = legacy_version[5];
    version_string[6] = legacy_version[6];
    version_string[7] = legacy_version[7];
    std::istream::read((char *)is,(long)(version_string + 0xc));
    for (lVar13 = 0; lVar13 != 0x23a0; lVar13 = lVar13 + 0x50) {
      if (((&(anonymous_namespace)::versions)[lVar13] != '\0') &&
         (iVar2 = bcmp(version_string,&(anonymous_namespace)::versions + lVar13,0x40), iVar2 == 0))
      {
        this->value = *(version_constant *)((long)&DAT_00172230 + lVar13);
        _Var10 = *(_WordT *)((long)&DAT_00172238 + lVar13);
        goto LAB_0013b460;
      }
    }
    version_str._M_dataplus._M_p = version_str._M_dataplus._M_p & 0xffffffffffffff00;
    pcVar7 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (version_string,local_38);
    version_str._M_dataplus._M_p = (pointer)&version_str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&version_str,version_string,pcVar7);
    bVar1 = boost::algorithm::contains<std::__cxx11::string,char[9],boost::algorithm::is_equal>
                      (&version_str,"Inno Setup");
    if (!bVar1) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = &PTR__exception_0016d398;
      __cxa_throw(puVar11,&version_error::typeinfo,std::exception::~exception);
    }
    this->value = 0;
LAB_0013b1c9:
    lVar13 = std::__cxx11::string::find((char)&version_str,0x28);
    if (lVar13 != -1) {
      if (((5 < version_str._M_string_length - lVar13) &&
          (lVar8 = std::__cxx11::string::find_first_not_of((char *)&version_str,0x14ffb4),
          lVar8 != -1)) && (version_str._M_dataplus._M_p[lVar8] == '.')) {
        uVar4 = util::to_unsigned(version_str._M_dataplus._M_p + lVar13 + 1,lVar8 - (lVar13 + 1));
        lVar13 = std::__cxx11::string::find_first_not_of((char *)&version_str,0x14ffb4);
        if ((lVar13 != -1) && (version_str._M_dataplus._M_p[lVar13] == '.')) {
          uVar5 = util::to_unsigned(version_str._M_dataplus._M_p + lVar8 + 1,lVar13 - (lVar8 + 1));
          uVar9 = std::__cxx11::string::find_first_not_of((char *)&version_str,0x14ffb4);
          if (uVar9 != 0xffffffffffffffff) {
            uVar6 = util::to_unsigned(version_str._M_dataplus._M_p + lVar13 + 1,uVar9 - (lVar13 + 1)
                                     );
            cVar12 = version_str._M_dataplus._M_p[uVar9];
            if (cVar12 == 'a') {
              uVar9 = uVar9 + 1;
              if (version_str._M_string_length <= uVar9) goto LAB_0013b1c9;
              cVar12 = version_str._M_dataplus._M_p[uVar9];
            }
            uVar3 = 0;
            if (cVar12 == '.') {
              lVar13 = std::__cxx11::string::find_first_not_of((char *)&version_str,0x14ffb4);
              count = lVar13 - (uVar9 + 1);
              uVar3 = 0;
              if (count != 0 && lVar13 != -1) {
                uVar3 = util::to_unsigned(version_str._M_dataplus._M_p + uVar9 + 1,count);
              }
            }
            uVar4 = uVar6 << 8 | uVar5 << 0x10 | uVar4 << 0x18 | uVar3;
            if (uVar4 < this->value) {
              uVar4 = this->value;
            }
            this->value = uVar4;
          }
        }
      }
      goto LAB_0013b1c9;
    }
    uVar4 = this->value;
    if (uVar4 == 0) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = &PTR__exception_0016d398;
      __cxa_throw(puVar11,&version_error::typeinfo,std::exception::~exception);
    }
    (this->variant)._flags.super__Base_bitset<1UL>._M_w = 0;
    if (((0x602ffff < uVar4) ||
        (bVar1 = boost::algorithm::contains<std::__cxx11::string,char[9],boost::algorithm::is_equal>
                           (&version_str,"(u)"), bVar1)) ||
       (bVar1 = boost::algorithm::contains<std::__cxx11::string,char[9],boost::algorithm::is_equal>
                          (&version_str,"(U)"), bVar1)) {
      flags<setup::version::flags_Enum_,_3UL>::operator|=(&this->variant,Unicode);
    }
    bVar1 = boost::algorithm::contains<std::__cxx11::string,char[9],boost::algorithm::is_equal>
                      (&version_str,"My Inno Setup Extensions");
    if ((bVar1) ||
       (bVar1 = boost::algorithm::contains<std::__cxx11::string,char[9],boost::algorithm::is_equal>
                          (&version_str,"with ISX"), bVar1)) {
      flags<setup::version::flags_Enum_,_3UL>::operator|=(&this->variant,ISX);
    }
    this->known = false;
    this_00 = &version_str;
LAB_0013b4f6:
    std::__cxx11::string::~string((string *)this_00);
  }
  return;
}

Assistant:

void version::load(std::istream & is) {
	
	static const char digits[] = "0123456789";
	
	BOOST_STATIC_ASSERT(sizeof(stored_legacy_version) <= sizeof(stored_version));
	
	stored_legacy_version legacy_version;
	is.read(legacy_version, std::streamsize(sizeof(legacy_version)));
	
	if(legacy_version[0] == 'i' && legacy_version[sizeof(legacy_version) - 1] == '\x1a') {
		
		for(size_t i = 0; i < size_t(boost::size(legacy_versions)); i++) {
			if(!memcmp(legacy_version, legacy_versions[i].name, sizeof(legacy_version))) {
				value = legacy_versions[i].version;
				variant = legacy_versions[i].variant;
				known = true;
				debug("known legacy version: \"" << versions[i].name << '"');
				return;
			}
		}
		
		debug("unknown legacy version: \""
		      << std::string(legacy_version, sizeof(legacy_version)) << '"');
		
		if(legacy_version[0] != 'i' || legacy_version[2] != '.' || legacy_version[4] != '.'
		   || legacy_version[7] != '-' || legacy_version[8] != '-') {
			throw version_error();
		}
		
		if(legacy_version[9] == '1' && legacy_version[10] == '6') {
			variant = Bits16;
		} else if(legacy_version[9] == '3' && legacy_version[10] == '2') {
			variant = 0;
		} else {
			throw version_error();
		}
		
		std::string version_str(legacy_version, sizeof(legacy_version));
		
		try {
			unsigned a = util::to_unsigned(version_str.data() + 1, 1);
			unsigned b = util::to_unsigned(version_str.data() + 3, 1);
			unsigned c = util::to_unsigned(version_str.data() + 5, 2);
			value = INNO_VERSION(a, b, c);
		} catch(const boost::bad_lexical_cast &) {
			throw version_error();
		}
		
		known = false;
		
		return;
	}
	
	stored_version version_string;
	BOOST_STATIC_ASSERT(sizeof(legacy_version) <= sizeof(version_string));
	memcpy(version_string, legacy_version, sizeof(legacy_version));
	is.read(version_string + sizeof(legacy_version),
	        std::streamsize(sizeof(version_string) - sizeof(legacy_version)));
	
	
	for(size_t i = 0; i < size_t(boost::size(versions)); i++) {
		if(versions[i].name[0] != '\0' && !memcmp(version_string, versions[i].name, sizeof(version_string))) {
			value = versions[i].version;
			variant = versions[i].variant;
			known = true;
			debug("known version: \"" << versions[i].name << '"');
			return;
		}
	}
	
	char * end = std::find(version_string, version_string + boost::size(version_string), '\0');
	std::string version_str(version_string, end);
	debug("unknown version: \"" << version_str << '"');
	if(!boost::contains(version_str, "Inno Setup")) {
		throw version_error();
	}
	
	value = 0;
	size_t bracket = version_str.find('(');
	for(; bracket != std::string::npos; bracket = version_str.find('(', bracket + 1)) {
		
		if(version_str.length() - bracket < 6) {
			continue;
		}
		
		try {
			
			size_t a_start = bracket + 1;
			size_t a_end = version_str.find_first_not_of(digits, a_start);
			if(a_end == std::string::npos || version_str[a_end] != '.') {
				continue;
			}
			unsigned a = util::to_unsigned(version_str.data() + a_start, a_end - a_start);
			
			size_t b_start = a_end + 1;
			size_t b_end = version_str.find_first_not_of(digits, b_start);
			if(b_end == std::string::npos || version_str[b_end] != '.') {
				continue;
			}
			unsigned b = util::to_unsigned(version_str.data() + b_start, b_end - b_start);
			
			size_t c_start = b_end + 1;
			size_t c_end = version_str.find_first_not_of(digits, c_start);
			if(c_end == std::string::npos) {
				continue;
			}
			unsigned c = util::to_unsigned(version_str.data() + c_start, c_end - c_start);
			
			size_t d_start = c_end;
			if(version_str[d_start] == 'a') {
				if(d_start + 1 >= version_str.length()) {
					continue;
				}
				d_start++;
			}
			
			unsigned d = 0;
			if(version_str[d_start] == '.') {
				d_start++;
				size_t d_end = version_str.find_first_not_of(digits, d_start);
				if(d_end != std::string::npos && d_end != d_start) {
					d = util::to_unsigned(version_str.data() + d_start, d_end - d_start);
				}
			}
			
			value = std::max(value, INNO_VERSION_EXT(a, b, c, d));
			
		} catch(const boost::bad_lexical_cast &) {
			continue;
		}
	}
	if(!value) {
		throw version_error();
	}
	
	variant = 0;
	if(value >= INNO_VERSION(6, 3, 0) ||
	   boost::contains(version_str, "(u)") || boost::contains(version_str, "(U)")) {
		variant |= Unicode;
	}
	if(boost::contains(version_str, "My Inno Setup Extensions") || boost::contains(version_str, "with ISX")) {
		variant |= ISX;
	}
	
	known = false;
}